

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAndisr<(moira::Instr)12,(moira::Mode)11,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 v;
  StrWriter *pSVar1;
  undefined2 in_CX;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Imu src;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Align align;
  undefined4 in_stack_ffffffffffffffdc;
  Imu local_20;
  undefined2 in_stack_ffffffffffffffe4;
  Imu im;
  
  im.raw = CONCAT22(in_CX,in_stack_ffffffffffffffe4);
  v = dasmRead<(moira::Size)2>
                ((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  Imu::Imu(&local_20,v);
  pSVar1 = StrWriter::operator<<(in_RSI);
  align.raw = in_RDI[5];
  StrWriter::operator<<(pSVar1,align);
  pSVar1 = StrWriter::operator<<((StrWriter *)CONCAT44(in_stack_ffffffffffffffdc,align.raw),im);
  StrWriter::operator<<(pSVar1,", SR");
  return;
}

Assistant:

void
Moira::dasmAndisr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imu ( dasmRead<S>(addr) );

    str << Ins<I>{} << tab << src << ", SR";
}